

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexWriter.cpp
# Opt level: O2

void __thiscall
Ptex::v2_2::PtexWriterBase::addMetaData
          (PtexWriterBase *this,char *key,MetaDataType t,void *value,int size)

{
  pointer pMVar1;
  size_t sVar2;
  ostream *poVar3;
  iterator iVar4;
  _Rb_tree_color *p_Var5;
  _Rb_tree_color _Var6;
  ulong uVar7;
  stringstream str;
  string local_1d8;
  undefined1 local_1b8 [392];
  
  sVar2 = strlen(key);
  if (sVar2 < 0x100) {
    if (size < 1) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      poVar3 = std::operator<<((ostream *)(local_1b8 + 0x10),
                               "PtexWriter error: meta data size <= 0 for \"");
      poVar3 = std::operator<<(poVar3,key);
      std::operator<<(poVar3,"\"");
      std::__cxx11::stringbuf::str();
      setError(this,&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b8,key,(allocator<char> *)&local_1d8);
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::find(&(this->_metamap)._M_t,(key_type *)local_1b8);
    std::__cxx11::string::~string((string *)local_1b8);
    if ((_Rb_tree_header *)iVar4._M_node == &(this->_metamap)._M_t._M_impl.super__Rb_tree_header) {
      uVar7 = (long)(this->_metadata).
                    super__Vector_base<Ptex::v2_2::PtexWriterBase::MetaEntry,_std::allocator<Ptex::v2_2::PtexWriterBase::MetaEntry>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->_metadata).
                    super__Vector_base<Ptex::v2_2::PtexWriterBase::MetaEntry,_std::allocator<Ptex::v2_2::PtexWriterBase::MetaEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      std::
      vector<Ptex::v2_2::PtexWriterBase::MetaEntry,_std::allocator<Ptex::v2_2::PtexWriterBase::MetaEntry>_>
      ::resize(&this->_metadata,(long)(uVar7 * 0x4000000 + 0x100000000) >> 0x20);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b8,key,(allocator<char> *)&local_1d8);
      p_Var5 = (_Rb_tree_color *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&this->_metamap,(key_type *)local_1b8);
      _Var6 = (_Rb_tree_color)(uVar7 >> 6);
      *p_Var5 = _Var6;
      std::__cxx11::string::~string((string *)local_1b8);
    }
    else {
      _Var6 = iVar4._M_node[2]._M_color;
    }
    pMVar1 = (this->_metadata).
             super__Vector_base<Ptex::v2_2::PtexWriterBase::MetaEntry,_std::allocator<Ptex::v2_2::PtexWriterBase::MetaEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::assign((char *)(pMVar1 + (int)_Var6));
    pMVar1[(int)_Var6].datatype = t;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&pMVar1[(int)_Var6].data,(long)size);
    memcpy(pMVar1[(int)_Var6].data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
           ._M_impl.super__Vector_impl_data._M_start,value,(long)size);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    poVar3 = std::operator<<((ostream *)(local_1b8 + 0x10),
                             "PtexWriter error: meta data key too long (max=255) \"");
    poVar3 = std::operator<<(poVar3,key);
    std::operator<<(poVar3,"\"");
    std::__cxx11::stringbuf::str();
    setError(this,&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  }
  return;
}

Assistant:

void PtexWriterBase::addMetaData(const char* key, MetaDataType t,
                                 const void* value, int size)
{
    if (strlen(key) > 255) {
        std::stringstream str;
        str << "PtexWriter error: meta data key too long (max=255) \"" << key << "\"";
        setError(str.str());
        return;
    }
    if (size <= 0) {
        std::stringstream str;
        str << "PtexWriter error: meta data size <= 0 for \"" << key << "\"";
        setError(str.str());
    }
    std::map<std::string,int>::iterator iter = _metamap.find(key);
    int index;
    if (iter != _metamap.end()) {
        // see if we already have this entry - if so, overwrite it
        index = iter->second;
    }
    else {
        // allocate a new entry
        index = (int)_metadata.size();
        _metadata.resize(index+1);
        _metamap[key] = index;
    }
    MetaEntry& m = _metadata[index];
    m.key = key;
    m.datatype = t;
    m.data.resize(size);
    memcpy(&m.data[0], value, size);
}